

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# denialofservice_tests.cpp
# Opt level: O0

void __thiscall denialofservice_tests::peer_discouragement::test_method(peer_discouragement *this)

{
  long lVar1;
  Options opts;
  bool bVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  undefined1 uVar5;
  undefined1 uVar6;
  undefined1 inbound_onion;
  CChainParams *this_00;
  value_type pCVar7;
  reference ppCVar8;
  pointer pPVar9;
  NodeId NVar10;
  lazy_ostream *plVar11;
  CAddress *addrBindIn;
  CNode *this_01;
  CAddress *addrIn;
  iterator ppCVar12;
  long in_FS_OFFSET;
  Mutex *in_stack_ffffffffffffebd8;
  CNode *pCVar13;
  ArgsManager *in_stack_ffffffffffffebe0;
  CService *this_02;
  CNode *pCVar14;
  unique_ptr<AddrMan,_std::default_delete<AddrMan>_> *in_stack_ffffffffffffebe8;
  CService *this_03;
  assertion_result *paVar15;
  undefined4 in_stack_ffffffffffffebf0;
  undefined4 uVar16;
  undefined4 in_stack_ffffffffffffebf4;
  CTxMemPool *in_stack_ffffffffffffebf8;
  direct_or_indirect *pdVar17;
  ConnmanTestMsg *this_04;
  ChainstateManager *in_stack_ffffffffffffec00;
  undefined4 in_stack_ffffffffffffec08;
  uint32_t in_stack_ffffffffffffec0c;
  CConnman *in_stack_ffffffffffffec10;
  allocator<char> *in_stack_ffffffffffffec18;
  undefined7 in_stack_ffffffffffffec20;
  undefined1 in_stack_ffffffffffffec27;
  BanMan *in_stack_ffffffffffffec28;
  int *in_stack_ffffffffffffec30;
  Warnings *in_stack_ffffffffffffec40;
  undefined8 in_stack_ffffffffffffec48;
  undefined7 in_stack_ffffffffffffec50;
  undefined1 in_stack_ffffffffffffec57;
  uint32_t in_stack_ffffffffffffec58;
  NetEventsInterface *pNVar18;
  undefined1 in_stack_ffffffffffffedaf;
  uint64_t in_stack_ffffffffffffedb0;
  shared_ptr<Sock> *nLocalHostNonceIn;
  undefined7 in_stack_ffffffffffffedb8;
  undefined1 in_stack_ffffffffffffedbf;
  CAddress *in_stack_ffffffffffffedc0;
  shared_ptr<Sock> *in_stack_ffffffffffffedc8;
  shared_ptr<Sock> *sock;
  undefined7 in_stack_ffffffffffffedd0;
  undefined1 in_stack_ffffffffffffedd7;
  CNode *in_stack_ffffffffffffedd8;
  CAddress *in_stack_ffffffffffffee30;
  undefined7 in_stack_ffffffffffffee38;
  undefined1 in_stack_ffffffffffffee3f;
  ConnectionType CVar19;
  undefined8 in_stack_ffffffffffffee40;
  undefined7 in_stack_ffffffffffffee50;
  undefined1 in_stack_ffffffffffffee57;
  CNode *node;
  iterator __end1;
  iterator __begin1;
  array<CNode_*,_3UL> *__range1;
  NodeId id;
  peer_discouragement *this_local;
  const_string local_eb0 [2];
  lazy_ostream local_e90 [2];
  assertion_result local_e70 [2];
  const_string local_e38 [2];
  lazy_ostream local_e18 [2];
  assertion_result local_df8 [2];
  const_string local_dc0 [2];
  lazy_ostream local_da0 [2];
  assertion_result local_d80 [2];
  const_string local_d48 [2];
  lazy_ostream local_d28 [2];
  assertion_result local_d08 [2];
  const_string local_cd0 [2];
  lazy_ostream local_cb0 [2];
  assertion_result local_c90 [2];
  const_string local_c58 [2];
  lazy_ostream local_c38 [2];
  assertion_result local_c18 [2];
  const_string local_be0 [2];
  lazy_ostream local_bc0 [2];
  assertion_result local_ba0 [2];
  allocator<char> local_b61 [17];
  const_string local_b50 [2];
  lazy_ostream local_b30 [2];
  assertion_result local_b10 [2];
  const_string local_ad8 [2];
  lazy_ostream local_ab8 [2];
  assertion_result local_a98 [2];
  const_string local_a60 [2];
  lazy_ostream local_a40 [2];
  assertion_result local_a20 [2];
  const_string local_9e8 [2];
  lazy_ostream local_9c8 [2];
  assertion_result local_9a8 [2];
  const_string local_970 [2];
  lazy_ostream local_950 [2];
  assertion_result local_930 [2];
  const_string local_8f8 [2];
  lazy_ostream local_8d8 [2];
  assertion_result local_8b8 [2];
  const_string local_880 [2];
  lazy_ostream local_860 [2];
  assertion_result local_840 [2];
  const_string local_808 [2];
  lazy_ostream local_7e8 [2];
  assertion_result local_7c8 [2];
  const_string local_790 [2];
  lazy_ostream local_770 [2];
  assertion_result local_750 [2];
  const_string local_718 [2];
  lazy_ostream local_6f8 [2];
  assertion_result local_6d8 [2];
  allocator<char> local_699 [17];
  const_string local_688 [2];
  lazy_ostream local_668 [2];
  assertion_result local_648 [2];
  const_string local_610 [2];
  lazy_ostream local_5f0 [2];
  assertion_result local_5d0 [2];
  const_string local_598 [2];
  lazy_ostream local_578 [2];
  assertion_result local_558 [2];
  const_string local_520 [2];
  lazy_ostream local_500 [2];
  assertion_result local_4e0 [2];
  allocator<char> local_4a1 [17];
  const_string local_490 [2];
  lazy_ostream local_470 [2];
  allocator<char> local_449;
  assertion_result local_448 [2];
  undefined1 local_410;
  undefined1 uStack_40f;
  ushort uStack_40e;
  undefined4 uStack_40c;
  undefined4 uStack_408;
  undefined1 uStack_404;
  undefined1 uStack_403;
  undefined2 uStack_402;
  undefined4 local_400;
  unique_ptr<PeerManager,_std::default_delete<PeerManager>_> peerLogic;
  __single_object connman;
  __single_object banman;
  undefined1 local_3d0 [40];
  direct_or_indirect local_3a8;
  undefined1 local_398;
  code *local_390;
  undefined1 local_388;
  direct_or_indirect local_380;
  undefined1 local_370;
  code *local_368;
  undefined1 local_360;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock33;
  undefined1 local_348 [88];
  undefined1 local_2f0 [88];
  undefined1 local_298 [88];
  array<CNode_*,_3UL> nodes;
  CNetAddr other_addr;
  array<CAddress,_3UL> addr;
  CService tor_service;
  CNetAddr tor_netaddr;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  MaybeCheckNotHeld(in_stack_ffffffffffffebd8);
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffec18,
             &in_stack_ffffffffffffec10->m_total_bytes_sent_mutex,
             (char *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
             (char *)in_stack_ffffffffffffec00,(int)((ulong)in_stack_ffffffffffffebf8 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffebf8 >> 0x18,0));
  ArgsManager::GetDataDirBase(in_stack_ffffffffffffebe0);
  fs::operator/((path *)CONCAT44(in_stack_ffffffffffffebf4,in_stack_ffffffffffffebf0),
                (char *)in_stack_ffffffffffffebe8);
  std::make_unique<BanMan,fs::path,decltype(nullptr),unsigned_int_const&>
            ((path *)in_stack_ffffffffffffec28,
             (void **)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
             (uint *)in_stack_ffffffffffffec18);
  fs::path::~path((path *)in_stack_ffffffffffffebd8);
  fs::path::~path((path *)in_stack_ffffffffffffebd8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_ffffffffffffebe8);
  std::unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_>::operator*
            ((unique_ptr<const_NetGroupManager,_std::default_delete<const_NetGroupManager>_> *)
             in_stack_ffffffffffffebe8);
  Params();
  std::make_unique<ConnmanTestMsg,int,int,AddrMan&,NetGroupManager_const&,CChainParams_const&>
            (in_stack_ffffffffffffec30,(int *)in_stack_ffffffffffffec28,
             (AddrMan *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
             (NetGroupManager *)in_stack_ffffffffffffec18,(CChainParams *)in_stack_ffffffffffffec10)
  ;
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator*
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)
             in_stack_ffffffffffffebe8);
  std::unique_ptr<AddrMan,_std::default_delete<AddrMan>_>::operator*(in_stack_ffffffffffffebe8);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::get
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)in_stack_ffffffffffffebd8);
  std::unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_>::operator*
            ((unique_ptr<ChainstateManager,_std::default_delete<ChainstateManager>_> *)
             in_stack_ffffffffffffebe8);
  std::unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_>::operator*
            ((unique_ptr<CTxMemPool,_std::default_delete<CTxMemPool>_> *)in_stack_ffffffffffffebe8);
  this_00 = (CChainParams *)
            std::unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_>::operator*
                      ((unique_ptr<node::Warnings,_std::default_delete<node::Warnings>_> *)
                       in_stack_ffffffffffffebe8);
  local_410 = 0;
  uStack_40f = 0;
  uStack_40c = 100;
  uStack_408 = 100;
  uStack_404 = 0;
  uStack_403 = 0;
  local_400 = 2000;
  this_02 = (CService *)CONCAT44(100,(uint)uStack_40e << 0x10);
  this_03 = (CService *)CONCAT26(uStack_402,100);
  opts.max_extra_txs = (int)in_stack_ffffffffffffec50;
  opts.capture_messages = (bool)(char)((uint7)in_stack_ffffffffffffec50 >> 0x20);
  opts.deterministic_rng = (bool)(char)((uint7)in_stack_ffffffffffffec50 >> 0x28);
  opts._14_1_ = (char)((uint7)in_stack_ffffffffffffec50 >> 0x30);
  opts.ignore_incoming_txs = (bool)(char)in_stack_ffffffffffffec48;
  opts.reconcile_txs = (bool)(char)((ulong)in_stack_ffffffffffffec48 >> 8);
  opts._2_2_ = (short)((ulong)in_stack_ffffffffffffec48 >> 0x10);
  opts.max_orphan_txs = (int)((ulong)in_stack_ffffffffffffec48 >> 0x20);
  opts._15_1_ = in_stack_ffffffffffffec57;
  opts.max_headers_result = in_stack_ffffffffffffec58;
  PeerManager::make(in_stack_ffffffffffffec10,
                    (AddrMan *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
                    in_stack_ffffffffffffec28,in_stack_ffffffffffffec00,in_stack_ffffffffffffebf8,
                    in_stack_ffffffffffffec40,opts);
  CNetAddr::CNetAddr(&this_02->super_CNetAddr);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)this_00)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_ffffffffffffec28,
               (char *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
               in_stack_ffffffffffffec18);
    CNetAddr::SetSpecial((CNetAddr *)in_stack_ffffffffffffec00,(string *)in_stack_ffffffffffffebf8);
    boost::test_tools::assertion_result::assertion_result
              ((assertion_result *)this_03,SUB81((ulong)this_02 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_00);
    boost::unit_test::operator<<((lazy_ostream *)this_02,(basic_cstring<const_char> *)this_00);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)this_03,(pointer)this_02,(unsigned_long)this_00);
    this_00 = (CChainParams *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_448,local_470,local_490,0x135,REQUIRE,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)this_00);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)this_00);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00);
    std::allocator<char>::~allocator(&local_449);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  Params();
  CChainParams::GetDefaultPort(this_00);
  CService::CService(this_03,&this_02->super_CNetAddr,(uint16_t)((ulong)this_00 >> 0x30));
  ip(in_stack_ffffffffffffec0c);
  CAddress::CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
                     (CService *)in_stack_ffffffffffffec00,(ServiceFlags)in_stack_ffffffffffffebf8);
  ip(in_stack_ffffffffffffec0c);
  CAddress::CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
                     (CService *)in_stack_ffffffffffffec00,(ServiceFlags)in_stack_ffffffffffffebf8);
  CService::CService(this_03,this_02);
  CAddress::CAddress((CAddress *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
                     (CService *)in_stack_ffffffffffffec00,(ServiceFlags)in_stack_ffffffffffffebf8);
  CService::~CService((CService *)this_00);
  CService::~CService((CService *)this_00);
  CService::~CService((CService *)this_00);
  ip(in_stack_ffffffffffffec0c);
  CNetAddr::CNetAddr(&this_03->super_CNetAddr,&this_02->super_CNetAddr);
  CService::~CService((CService *)this_00);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)this_00);
  BanMan::ClearBanned((BanMan *)this_00);
  pCVar7 = (value_type)operator_new(0x3a8);
  std::shared_ptr<Sock>::shared_ptr((shared_ptr<Sock> *)this_00,(nullptr_t)0x5bf795);
  std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)this_03,(size_type)this_02);
  CAddress::CAddress((CAddress *)in_stack_ffffffffffffebf8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec28,
             (char *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
             in_stack_ffffffffffffec18);
  local_380._0_4_ = 0;
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)this_00,
             (nullptr_t)0x5bf818);
  local_370 = 0;
  local_368 = std::__atomic_base<unsigned_long>::operator=;
  local_360 = 0;
  pdVar17 = &local_380;
  pCVar14 = (CNode *)local_298;
  pCVar13 = (CNode *)(local_298 + 0x20);
  paVar15 = (assertion_result *)((ulong)this_03 & 0xffffffff00000000);
  CNode::CNode(in_stack_ffffffffffffedd8,
               CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
               in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
               CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
               in_stack_ffffffffffffedb0,in_stack_ffffffffffffee30,
               (string *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),
               (ConnectionType)in_stack_ffffffffffffee40,(bool)in_stack_ffffffffffffedaf,
               (CNodeOptions *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  *ppCVar8 = pCVar7;
  CNodeOptions::~CNodeOptions((CNodeOptions *)pCVar13);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar13);
  std::allocator<char>::~allocator(local_4a1);
  CAddress::~CAddress((CAddress *)pCVar13);
  std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  CNode::SetCommonVersion(pCVar14,(int)((ulong)pCVar13 >> 0x20));
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  (**(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&pPVar9->super_NetEventsInterface,*ppCVar8,1);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  std::atomic<bool>::operator=((atomic<bool> *)pCVar13,false);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)in_stack_ffffffffffffec10,
             (CNode *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  NVar10 = CNode::GetId(pCVar13);
  (*(pPVar9->super_CValidationInterface)._vptr_CValidationInterface[0x13])(pPVar9,NVar10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
    ppCVar8 = std::array<CNode_*,_3UL>::operator[]
                        ((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    (*(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface[4])
              (&pPVar9->super_NetEventsInterface,*ppCVar8);
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_4e0,local_500,local_520,0x150,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_558,local_578,local_598,0x152,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_5d0,local_5f0,local_610,0x153,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_648,local_668,local_688,0x154,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    CVar19 = (ConnectionType)in_stack_ffffffffffffee40;
  } while (bVar2);
  pCVar7 = (value_type)operator_new(0x3a8);
  std::shared_ptr<Sock>::shared_ptr((shared_ptr<Sock> *)pCVar13,(nullptr_t)0x5c00b2);
  std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
  CAddress::CAddress((CAddress *)&pdVar17->indirect_contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec28,
             (char *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
             in_stack_ffffffffffffec18);
  local_3a8._0_4_ = 0;
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)pCVar13,
             (nullptr_t)0x5c012a);
  local_398 = 0;
  local_390 = std::__atomic_base<unsigned_long>::operator=;
  local_388 = 0;
  pdVar17 = &local_3a8;
  pCVar14 = (CNode *)local_2f0;
  pCVar13 = (CNode *)(local_2f0 + 0x20);
  uVar16 = 0;
  paVar15 = (assertion_result *)((ulong)paVar15 & 0xffffffff00000000);
  CNode::CNode(in_stack_ffffffffffffedd8,
               CONCAT17(in_stack_ffffffffffffedd7,in_stack_ffffffffffffedd0),
               in_stack_ffffffffffffedc8,in_stack_ffffffffffffedc0,
               CONCAT17(in_stack_ffffffffffffedbf,in_stack_ffffffffffffedb8),
               in_stack_ffffffffffffedb0,in_stack_ffffffffffffee30,
               (string *)CONCAT17(in_stack_ffffffffffffee3f,in_stack_ffffffffffffee38),CVar19,
               (bool)in_stack_ffffffffffffedaf,
               (CNodeOptions *)CONCAT17(in_stack_ffffffffffffee57,in_stack_ffffffffffffee50));
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  *ppCVar8 = pCVar7;
  CNodeOptions::~CNodeOptions((CNodeOptions *)pCVar13);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar13);
  std::allocator<char>::~allocator(local_699);
  CAddress::~CAddress((CAddress *)pCVar13);
  std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  CNode::SetCommonVersion(pCVar14,(int)((ulong)pCVar13 >> 0x20));
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  (**(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&pPVar9->super_NetEventsInterface,*ppCVar8,1);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  std::atomic<bool>::operator=((atomic<bool> *)pCVar13,false);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)in_stack_ffffffffffffec10,
             (CNode *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
    ppCVar8 = std::array<CNode_*,_3UL>::operator[]
                        ((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    (*(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface[4])
              (&pPVar9->super_NetEventsInterface,*ppCVar8);
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_6d8,local_6f8,local_718,0x163,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_750,local_770,local_790,0x165,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_7c8,local_7e8,local_808,0x166,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_840,local_860,local_880,0x168,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    uVar3 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar3);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    std::atomic::operator_cast_to_bool((atomic<bool> *)CONCAT44(in_stack_ffffffffffffebf4,uVar16));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    plVar11 = boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_8b8,local_8d8,local_8f8,0x169,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    uVar4 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar4);
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  addrBindIn = (CAddress *)CNode::GetId(pCVar13);
  (*(pPVar9->super_CValidationInterface)._vptr_CValidationInterface[0x13])(pPVar9,addrBindIn);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
    ppCVar8 = std::array<CNode_*,_3UL>::operator[]
                        ((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    (*(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface[4])
              (&pPVar9->super_NetEventsInterface,*ppCVar8);
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_930,local_950,local_970,0x16b,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    this_01 = (CNode *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_9a8,local_9c8,local_9e8,0x16d,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    uVar5 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar5);
  do {
    sock = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    addrIn = (CAddress *)boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a20,local_a40,local_a60,0x16e,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    uVar6 = boost::test_tools::tt_detail::dummy_cond();
  } while ((bool)uVar6);
  do {
    nLocalHostNonceIn = boost::unit_test::(anonymous_namespace)::unit_test_log;
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    inbound_onion =
         BanMan::IsDiscouraged
                   ((BanMan *)in_stack_ffffffffffffec10,
                    (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_a98,local_ab8,local_ad8,0x16f,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_b10,local_b30,local_b50,0x170,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
    CVar19 = (ConnectionType)plVar11;
  } while (bVar2);
  pCVar7 = (value_type)operator_new(0x3a8);
  std::shared_ptr<Sock>::shared_ptr((shared_ptr<Sock> *)pCVar13,(nullptr_t)0x5c12e9);
  std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
  uVar16 = (undefined4)((ulong)paVar15 >> 0x20);
  CAddress::CAddress((CAddress *)&pdVar17->indirect_contents);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_ffffffffffffec28,
             (char *)CONCAT17(in_stack_ffffffffffffec27,in_stack_ffffffffffffec20),
             in_stack_ffffffffffffec18);
  local_3d0._0_4_ = 0;
  std::unique_ptr<i2p::sam::Session,std::default_delete<i2p::sam::Session>>::
  unique_ptr<std::default_delete<i2p::sam::Session>,void>
            ((unique_ptr<i2p::sam::Session,_std::default_delete<i2p::sam::Session>_> *)pCVar13,
             (nullptr_t)0x5c1361);
  local_3d0[0x10] = '\0';
  local_3d0._24_8_ = std::__atomic_base<unsigned_long>::operator=;
  local_3d0[0x20] = '\0';
  this_04 = (ConnmanTestMsg *)local_3d0;
  pCVar14 = (CNode *)local_348;
  pCVar13 = (CNode *)(local_348 + 0x20);
  paVar15 = (assertion_result *)CONCAT44(uVar16,1);
  CNode::CNode(this_01,CONCAT17(uVar5,in_stack_ffffffffffffedd0),sock,addrIn,
               CONCAT17(uVar6,in_stack_ffffffffffffedb8),(uint64_t)nLocalHostNonceIn,addrBindIn,
               (string *)CONCAT17(uVar4,in_stack_ffffffffffffee38),CVar19,(bool)inbound_onion,
               (CNodeOptions *)CONCAT17(uVar3,in_stack_ffffffffffffee50));
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  *ppCVar8 = pCVar7;
  CNodeOptions::~CNodeOptions((CNodeOptions *)pCVar13);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pCVar13);
  std::allocator<char>::~allocator(local_b61);
  CAddress::~CAddress((CAddress *)pCVar13);
  std::shared_ptr<Sock>::~shared_ptr((shared_ptr<Sock> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  CNode::SetCommonVersion(pCVar14,(int)((ulong)pCVar13 >> 0x20));
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  ppCVar8 = std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  (**(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface)
            (&pPVar9->super_NetEventsInterface,*ppCVar8,1);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  std::atomic<bool>::operator=((atomic<bool> *)pCVar13,false);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  ConnmanTestMsg::AddTestNode
            ((ConnmanTestMsg *)in_stack_ffffffffffffec10,
             (CNode *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
  pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                     ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
  std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
  NVar10 = CNode::GetId(pCVar13);
  (*(pPVar9->super_CValidationInterface)._vptr_CValidationInterface[0x13])(pPVar9,NVar10);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
    pNVar18 = &pPVar9->super_NetEventsInterface;
    ppCVar8 = std::array<CNode_*,_3UL>::operator[]
                        ((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    (*(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface[4])(pNVar18,*ppCVar8);
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_ba0,local_bc0,local_be0,0x182,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c18,local_c38,local_c58,0x183,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_c90,local_cb0,local_cd0,0x184,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::operator->
              ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)pCVar13);
    std::array<CAddress,_3UL>::operator[]((array<CAddress,_3UL> *)paVar15,(size_type)pCVar14);
    BanMan::IsDiscouraged
              ((BanMan *)in_stack_ffffffffffffec10,
               (CNetAddr *)CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08));
    boost::test_tools::assertion_result::assertion_result(paVar15,SUB81((ulong)pCVar14 >> 0x38,0));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d08,local_d28,local_d48,0x185,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_d80,local_da0,local_dc0,0x186,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_df8,local_e18,local_e38,0x187,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring((basic_cstring<const_char> *)pCVar13)
    ;
    boost::unit_test::unit_test_log_t::set_checkpoint
              ((unit_test_log_t *)in_stack_ffffffffffffec18,
               (const_string *)in_stack_ffffffffffffec10,
               CONCAT44(in_stack_ffffffffffffec0c,in_stack_ffffffffffffec08),
               (const_string *)in_stack_ffffffffffffec00);
    std::array<CNode_*,_3UL>::operator[]((array<CNode_*,_3UL> *)paVar15,(size_type)pCVar14);
    boost::test_tools::assertion_result::assertion_result<std::atomic<bool>>
              (paVar15,(atomic<bool> *)pCVar14);
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    boost::unit_test::operator<<((lazy_ostream *)pCVar14,(basic_cstring<const_char> *)pCVar13);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)paVar15,(pointer)pCVar14,(unsigned_long)pCVar13);
    pCVar13 = (CNode *)0x0;
    boost::test_tools::tt_detail::report_assertion
              (local_e70,local_e90,local_eb0,0x188,CHECK,CHECK_PRED);
    boost::unit_test::
    lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                *)pCVar13);
    boost::test_tools::assertion_result::~assertion_result((assertion_result *)pCVar13);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  __begin1 = std::array<CNode_*,_3UL>::begin((array<CNode_*,_3UL> *)pCVar13);
  ppCVar12 = std::array<CNode_*,_3UL>::end((array<CNode_*,_3UL> *)pCVar13);
  for (; __begin1 != ppCVar12; __begin1 = __begin1 + 1) {
    pCVar7 = *__begin1;
    pPVar9 = std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::operator->
                       ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)pCVar13);
    (*(pPVar9->super_NetEventsInterface)._vptr_NetEventsInterface[1])
              (&pPVar9->super_NetEventsInterface,pCVar7);
  }
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::operator->
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)pCVar13);
  ConnmanTestMsg::ClearTestNodes(this_04);
  CNetAddr::~CNetAddr((CNetAddr *)pCVar13);
  std::array<CAddress,_3UL>::~array((array<CAddress,_3UL> *)paVar15);
  CService::~CService((CService *)pCVar13);
  CNetAddr::~CNetAddr((CNetAddr *)pCVar13);
  std::unique_ptr<PeerManager,_std::default_delete<PeerManager>_>::~unique_ptr
            ((unique_ptr<PeerManager,_std::default_delete<PeerManager>_> *)paVar15);
  std::unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_>::~unique_ptr
            ((unique_ptr<ConnmanTestMsg,_std::default_delete<ConnmanTestMsg>_> *)paVar15);
  std::unique_ptr<BanMan,_std::default_delete<BanMan>_>::~unique_ptr
            ((unique_ptr<BanMan,_std::default_delete<BanMan>_> *)paVar15);
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)pCVar13);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(peer_discouragement)
{
    LOCK(NetEventsInterface::g_msgproc_mutex);

    auto banman = std::make_unique<BanMan>(m_args.GetDataDirBase() / "banlist", nullptr, DEFAULT_MISBEHAVING_BANTIME);
    auto connman = std::make_unique<ConnmanTestMsg>(0x1337, 0x1337, *m_node.addrman, *m_node.netgroupman, Params());
    auto peerLogic = PeerManager::make(*connman, *m_node.addrman, banman.get(), *m_node.chainman, *m_node.mempool, *m_node.warnings, {});

    CNetAddr tor_netaddr;
    BOOST_REQUIRE(
        tor_netaddr.SetSpecial("pg6mmjiyjmcrsslvykfwnntlaru7p5svn6y2ymmju6nubxndf4pscryd.onion"));
    const CService tor_service{tor_netaddr, Params().GetDefaultPort()};

    const std::array<CAddress, 3> addr{CAddress{ip(0xa0b0c001), NODE_NONE},
                                       CAddress{ip(0xa0b0c002), NODE_NONE},
                                       CAddress{tor_service, NODE_NONE}};

    const CNetAddr other_addr{ip(0xa0b0ff01)}; // Not any of addr[].

    std::array<CNode*, 3> nodes;

    banman->ClearBanned();
    NodeId id{0};
    nodes[0] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[0],
                         /*nKeyedNetGroupIn=*/0,
                         /*nLocalHostNonceIn=*/0,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[0]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[0], NODE_NETWORK);
    nodes[0]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[0]);
    peerLogic->UnitTestMisbehaving(nodes[0]->GetId()); // Should be discouraged
    BOOST_CHECK(peerLogic->SendMessages(nodes[0]));

    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(!banman->IsDiscouraged(other_addr)); // Different address, not discouraged

    nodes[1] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[1],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::INBOUND,
                         /*inbound_onion=*/false};
    nodes[1]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[1], NODE_NETWORK);
    nodes[1]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[1]);
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // [0] is still discouraged/disconnected.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    // [1] is not discouraged/disconnected yet.
    BOOST_CHECK(!banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(!nodes[1]->fDisconnect);
    peerLogic->UnitTestMisbehaving(nodes[1]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[1]));
    // Expect both [0] and [1] to be discouraged/disconnected now.
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(nodes[1]->fDisconnect);

    // Make sure non-IP peers are discouraged and disconnected properly.

    nodes[2] = new CNode{id++,
                         /*sock=*/nullptr,
                         addr[2],
                         /*nKeyedNetGroupIn=*/1,
                         /*nLocalHostNonceIn=*/1,
                         CAddress(),
                         /*addrNameIn=*/"",
                         ConnectionType::OUTBOUND_FULL_RELAY,
                         /*inbound_onion=*/false};
    nodes[2]->SetCommonVersion(PROTOCOL_VERSION);
    peerLogic->InitializeNode(*nodes[2], NODE_NETWORK);
    nodes[2]->fSuccessfullyConnected = true;
    connman->AddTestNode(*nodes[2]);
    peerLogic->UnitTestMisbehaving(nodes[2]->GetId());
    BOOST_CHECK(peerLogic->SendMessages(nodes[2]));
    BOOST_CHECK(banman->IsDiscouraged(addr[0]));
    BOOST_CHECK(banman->IsDiscouraged(addr[1]));
    BOOST_CHECK(banman->IsDiscouraged(addr[2]));
    BOOST_CHECK(nodes[0]->fDisconnect);
    BOOST_CHECK(nodes[1]->fDisconnect);
    BOOST_CHECK(nodes[2]->fDisconnect);

    for (CNode* node : nodes) {
        peerLogic->FinalizeNode(*node);
    }
    connman->ClearTestNodes();
}